

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture.h
# Opt level: O0

void __thiscall Texture::Texture(Texture *this,Vector3f *c)

{
  bool bVar1;
  Vector3f *in_RSI;
  function<Vector2f_(Vector2f)> *in_RDI;
  Vector3f *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  
  *(float *)&(in_RDI->super__Function_base)._M_functor = 0.0;
  Vector3f::Vector3f((Vector3f *)in_RDI,in_stack_ffffffffffffffc8);
  std::function<Vector2f_(Vector2f)>::function(in_RDI);
  in_RDI[3].super__Function_base._M_functor._M_pod_data[0] = '\0';
  bVar1 = ::operator==((Vector3f *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                       in_RSI);
  if (bVar1) {
    in_RDI[3].super__Function_base._M_functor._M_pod_data[0] = '\x01';
  }
  return;
}

Assistant:

Texture(Vector3f c) :type(TEXTURE_COLOR), color(c) {
		if (c == Vector3f::ZERO) empty = true;
	}